

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::PrintGencodeVersionValidator
          (java *this,Printer *printer,bool oss_runtime,string_view java_class_name)

{
  string_view pc;
  Printer *this_00;
  int32_t iVar1;
  string *str;
  AlphaNum *pAVar2;
  undefined7 in_register_00000011;
  AlphaNum *c;
  AlphaNum local_318;
  Printer *local_2e8;
  size_t sStack_2e0;
  AlphaNum local_2d8;
  string local_2a8;
  AlphaNum local_288;
  AlphaNum local_258;
  AlphaNum local_228;
  string local_1f8;
  AlphaNum local_1d8;
  AlphaNum local_1a8;
  string local_178;
  AlphaNum local_158;
  AlphaNum local_118;
  string local_e8;
  AlphaNum local_c8;
  AlphaNum local_98;
  string local_68;
  char *local_48;
  string_view local_40;
  Version *local_30;
  Version *version;
  Printer *pPStack_20;
  bool oss_runtime_local;
  Printer *printer_local;
  string_view java_class_name_local;
  
  printer_local = (Printer *)CONCAT71(in_register_00000011,oss_runtime);
  c = (AlphaNum *)java_class_name._M_str;
  java_class_name_local._M_len = java_class_name._M_len;
  version._7_1_ = (byte)printer & 1;
  pPStack_20 = (Printer *)this;
  local_30 = GetProtobufJavaVersion((bool)version._7_1_);
  this_00 = pPStack_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,
             "com.google.protobuf.RuntimeVersion.validateProtobufGencodeVersion(\n  com.google.protobuf.RuntimeVersion.RuntimeDomain.$domain$,\n  $major$,\n  $minor$,\n  $patch$,\n  $suffix$,\n  $location$);\n"
            );
  pAVar2 = (AlphaNum *)0x1fbb419;
  local_48 = "_runtime_version.Domain.GOOGLE_INTERNAL";
  if ((version._7_1_ & 1) != 0) {
    local_48 = "_runtime_version.Domain.PUBLIC";
  }
  local_48 = local_48 + 0x18;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_98,"/* major= */ ");
  iVar1 = Version::major(local_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,iVar1);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_68,(lts_20250127 *)&local_98,&local_c8,pAVar2);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_118,"/* minor= */ ");
  iVar1 = Version::minor(local_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_158,iVar1);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_e8,(lts_20250127 *)&local_118,&local_158,pAVar2);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1a8,"/* patch= */ ");
  iVar1 = Version::patch(local_30);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1d8,iVar1);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_178,(lts_20250127 *)&local_1a8,&local_1d8,pAVar2);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_228,"/* suffix= */ \"");
  str = Version::suffix_abi_cxx11_(local_30);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_258,str);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_288,"\"");
  pAVar2 = &local_288;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_1f8,(lts_20250127 *)&local_228,&local_258,pAVar2,c);
  local_2e8 = printer_local;
  sStack_2e0 = java_class_name_local._M_len;
  pc._M_str = (char *)java_class_name_local._M_len;
  pc._M_len = (size_t)printer_local;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,pc);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_318,".class.getName()");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_2a8,(lts_20250127 *)&local_2d8,&local_318,pAVar2);
  protobuf::io::Printer::
  Print<char[7],char_const*,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (this_00,local_40,(char (*) [7])"domain",&local_48,(char (*) [6])"major",&local_68,
             (char (*) [6])"minor",&local_e8,(char (*) [6])"patch",&local_178,
             (char (*) [7])0x1fba659,&local_1f8,(char (*) [9])0x1ce1a94,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void PrintGencodeVersionValidator(io::Printer* printer, bool oss_runtime,
                                  absl::string_view java_class_name) {
  const auto& version = GetProtobufJavaVersion(oss_runtime);
  printer->Print(
      "com.google.protobuf.RuntimeVersion.validateProtobufGencodeVersion(\n"
      "  com.google.protobuf.RuntimeVersion.RuntimeDomain.$domain$,\n"
      "  $major$,\n"
      "  $minor$,\n"
      "  $patch$,\n"
      "  $suffix$,\n"
      "  $location$);\n",
      "domain", oss_runtime ? "PUBLIC" : "GOOGLE_INTERNAL", "major",
      absl::StrCat("/* major= */ ", version.major()), "minor",
      absl::StrCat("/* minor= */ ", version.minor()), "patch",
      absl::StrCat("/* patch= */ ", version.patch()), "suffix",
      absl::StrCat("/* suffix= */ \"", version.suffix(), "\""), "location",
      absl::StrCat(java_class_name, ".class.getName()"));
}